

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::DefineUserVars(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  SymbolType SVar5;
  PropertyId propertyId_00;
  uint uVar6;
  RegSlot RVar7;
  int iVar8;
  FunctionBody *this_00;
  ParseNodeVar *pPVar9;
  IdentPtr pid;
  Scope *pSVar10;
  FunctionBody *this_01;
  undefined4 *puVar11;
  CharacterBuffer<char16_t> *pCVar12;
  Type *pTVar13;
  RegSlot local_5c;
  int local_50;
  int i;
  RegSlot reg_1;
  RegSlot reg;
  PropertyId propertyId;
  Symbol *sym;
  RegSlot tmpReg;
  FunctionBody *byteCodeFunction;
  ParseNode *pnode;
  BOOL fGlobal;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar3 = FuncInfo::IsGlobalFunction(funcInfo);
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  if (bVar3) {
    local_5c = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  else {
    local_5c = 0xffffffff;
  }
  byteCodeFunction = (FunctionBody *)funcInfo->root->pnodeVars;
  do {
    if (byteCodeFunction == (FunctionBody *)0x0) {
      if (local_5c != 0xffffffff) {
        FuncInfo::ReleaseTmpRegister(funcInfo,local_5c);
      }
      for (local_50 = 0;
          iVar8 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                            (&(funcInfo->nonUserNonTempRegistersToInitialize).
                              super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>
                            ), local_50 < iVar8; local_50 = local_50 + 1) {
        pTVar13 = JsUtil::
                  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(&funcInfo->nonUserNonTempRegistersToInitialize,local_50);
        Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,*pTVar13);
      }
      return;
    }
    pPVar9 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeFunction);
    _reg = pPVar9->sym;
    if ((_reg != (Symbol *)0x0) &&
       ((pPVar9 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeFunction),
        pPVar9->isBlockScopeFncDeclVar == '\0' || (bVar4 = Symbol::GetIsBlockVar(_reg), !bVar4)))) {
      bVar4 = Symbol::IsSpecialSymbol(_reg);
      if (bVar4) {
        bVar4 = ParseNodeFnc::HasNonSimpleParameterList(funcInfo->root);
        if (!bVar4) {
          RVar7 = Symbol::GetLocation(_reg);
          pid = Symbol::GetPid(_reg);
          EmitPropStoreForSpecialSymbol(this,RVar7,_reg,pid,funcInfo,true);
          bVar4 = ShouldTrackDebuggerMetadata(this);
          if ((bVar4) && (bVar4 = Symbol::IsInSlot(_reg,this,funcInfo,false), !bVar4)) {
            pCVar12 = Symbol::GetName(_reg);
            RVar7 = Symbol::GetLocation(_reg);
            Js::FunctionBody::InsertSymbolToRegSlotList
                      (this_00,pCVar12,RVar7,funcInfo->varRegsCount);
          }
        }
      }
      else {
        bVar4 = Symbol::GetIsCatch(_reg);
        if ((bVar4) ||
           ((*(char *)&(byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject == 'Q' &&
            (bVar4 = Symbol::GetIsBlockVar(_reg), bVar4)))) {
          bVar4 = Symbol::IsArguments(_reg);
          if (bVar4) {
            bVar4 = FuncInfo::GetHasArguments(funcInfo);
            if (bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x568,"(!funcInfo->GetHasArguments())",
                                 "!funcInfo->GetHasArguments()");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
            goto LAB_00b353cc;
          }
          bVar4 = Symbol::GetIsCatch(_reg);
          if ((!bVar4) &&
             (pSVar1 = funcInfo->bodyScope, pSVar10 = Symbol::GetScope(_reg), pSVar1 == pSVar10)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x56e,"(funcInfo->bodyScope != sym->GetScope())",
                               "funcInfo->bodyScope != sym->GetScope()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          pSVar1 = funcInfo->bodyScope;
          pCVar12 = Symbol::GetName(_reg);
          _reg = Scope::FindLocalSymbol(pSVar1,pCVar12);
          if (((_reg == (Symbol *)0x0) || (bVar4 = Symbol::GetIsCatch(_reg), bVar4)) ||
             (bVar4 = Symbol::GetIsBlockVar(_reg), bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x572,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                               "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        SVar5 = Symbol::GetSymbolType(_reg);
        if ((SVar5 == STVariable) && (bVar4 = Symbol::GetIsModuleExportStorage(_reg), !bVar4)) {
          if (bVar3) {
            propertyId_00 = Symbol::EnsurePosition(_reg,this);
            if ((this->flags & 0x400) == 0) {
              uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId_00);
              Js::ByteCodeWriter::ElementU(&this->m_writer,LdElemUndef,0xfffffffd,uVar6);
            }
            else {
              bVar4 = Js::ParseableFunctionInfo::GetIsStrictMode(funcInfo->byteCodeFunction);
              if (bVar4) {
                uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId_00);
                Js::ByteCodeWriter::ElementRootU(&this->m_writer,LdLocalElemUndef,uVar6);
              }
              else {
                uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId_00);
                Js::ByteCodeWriter::ElementScopedU(&this->m_writer,LdElemUndefScoped,uVar6);
              }
            }
          }
          else {
            bVar4 = Symbol::IsArguments(_reg);
            if (bVar4) {
              bVar4 = ShouldTrackDebuggerMetadata(this);
              if (((bVar4) && (bVar4 = Symbol::GetHasInit(_reg), !bVar4)) &&
                 ((bVar4 = Symbol::IsInSlot(_reg,this,funcInfo,false), !bVar4 &&
                  (RVar7 = Symbol::GetLocation(_reg), RVar7 != 0xffffffff)))) {
                pCVar12 = Symbol::GetName(_reg);
                Js::FunctionBody::InsertSymbolToRegSlotList
                          (this_00,pCVar12,RVar7,funcInfo->varRegsCount);
              }
            }
            else {
              bVar4 = Symbol::NeedsSlotAlloc(_reg,this,funcInfo);
              if (bVar4) {
                bVar4 = Symbol::GetHasNonCommittedReference(_reg);
                if (bVar4) {
                  bVar4 = Symbol::GetHasFuncAssignment(_reg);
                  if (bVar4) {
                    this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
                    bVar4 = Js::ParseableFunctionInfo::DoStackNestedFunc
                                      (&this_01->super_ParseableFunctionInfo);
                    if (bVar4) goto LAB_00b351a6;
                  }
                }
                else {
LAB_00b351a6:
                  Symbol::SetIsCommittedToSlot(_reg);
                }
              }
              bVar4 = Symbol::GetHasInit(_reg);
              if (((!bVar4) && (bVar4 = Symbol::IsInSlot(_reg,this,funcInfo,false), !bVar4)) ||
                 ((bVar4 = Scope::GetIsObject(funcInfo->bodyScope), bVar4 &&
                  (bVar4 = FuncInfo::GetHasCachedScope(funcInfo), !bVar4)))) {
                i = Symbol::GetLocation(_reg);
                if (i == 0xffffffff) {
                  bVar4 = Symbol::IsInSlot(_reg,this,funcInfo,false);
                  if (!bVar4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar11 = 1;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                       ,0x5a8,"(sym->IsInSlot(this, funcInfo))",
                                       "sym->IsInSlot(this, funcInfo)");
                    if (!bVar4) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar11 = 0;
                  }
                  i = FuncInfo::AcquireTmpRegister(funcInfo);
                }
                Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,i);
                EmitLocalPropInit(this,i,_reg,funcInfo);
                bVar4 = ShouldTrackDebuggerMetadata(this);
                if (((bVar4) && (bVar4 = Symbol::GetHasInit(_reg), !bVar4)) &&
                   (bVar4 = Symbol::IsInSlot(_reg,this,funcInfo,false), !bVar4)) {
                  pCVar12 = Symbol::GetName(_reg);
                  Js::FunctionBody::InsertSymbolToRegSlotList
                            (this_00,pCVar12,i,funcInfo->varRegsCount);
                }
                FuncInfo::ReleaseTmpRegister(funcInfo,i);
              }
            }
          }
          Symbol::SetHasInit(_reg,true);
        }
      }
    }
LAB_00b353cc:
    pPVar9 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeFunction);
    byteCodeFunction = (FunctionBody *)pPVar9->pnodeNext;
  } while( true );
}

Assistant:

void ByteCodeGenerator::DefineUserVars(FuncInfo *funcInfo)
{
    // Initialize scope-wide variables on entry to the scope. TODO: optimize by detecting uses that are always reached
    // by an existing initialization.

    BOOL fGlobal = funcInfo->IsGlobalFunction();
    ParseNode *pnode;
    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    // Global declarations need a temp register to hold the init value, but the node shouldn't get a register.
    // Just assign one on the fly and re-use it for all initializations.
    Js::RegSlot tmpReg = fGlobal ? funcInfo->AcquireTmpRegister() : Js::Constants::NoRegister;

    for (pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym != nullptr && !(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
        {
            if (sym->IsSpecialSymbol())
            {
                // Special symbols have already had their initial values stored into their registers.
                // In default-argument case we've stored those values into their slot locations, as well.
                // We must do that because a default parameter may access a special symbol through a scope slot.
                // In the non-default-argument case, though, we didn't yet store the values into the
                // slots so let's do that now.
                if (!funcInfo->root->HasNonSimpleParameterList())
                {
                    EmitPropStoreForSpecialSymbol(sym->GetLocation(), sym, sym->GetPid(), funcInfo, true);

                    if (ShouldTrackDebuggerMetadata() && !sym->IsInSlot(this, funcInfo))
                    {
                        byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
                    }
                }

                continue;
            }

            if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
            {
                // The init node was bound to the catch object, because it's inside a catch and has the
                // same name as the catch object. But we want to define a user var at function scope,
                // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
                // This also applies to a var declaration in the same scope as a let declaration.
#if DBG
                if (sym->IsArguments())
                {
                    // There is a block scoped var named arguments
                    Assert(!funcInfo->GetHasArguments());
                    continue;
                }
                else if (!sym->GetIsCatch())
                {
                    // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
                    Assert(funcInfo->bodyScope != sym->GetScope());
                }
#endif
                sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
            }

            if (sym->GetSymbolType() == STVariable && !sym->GetIsModuleExportStorage())
            {
                if (fGlobal)
                {
                    Js::PropertyId propertyId = sym->EnsurePosition(this);

                    // We do need to initialize some globals to avoid JS errors on loading undefined variables.
                    // But we first need to make sure we're not trashing built-ins.

                    if (this->flags & fscrEval)
                    {
                        if (funcInfo->byteCodeFunction->GetIsStrictMode())
                        {
                            // Check/Init the property of the frame object
                            this->m_writer.ElementRootU(Js::OpCode::LdLocalElemUndef,
                                funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                        else
                        {
                            // The check and the init involve the first element in the scope chain.
                            this->m_writer.ElementScopedU(
                                Js::OpCode::LdElemUndefScoped, funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                    }
                    else
                    {
                        this->m_writer.ElementU(Js::OpCode::LdElemUndef, ByteCodeGenerator::RootObjectRegister,
                            funcInfo->FindOrAddReferencedPropertyId(propertyId));
                    }
                }
                else if (!sym->IsArguments())
                {
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        if (!sym->GetHasNonCommittedReference() ||
                            (sym->GetHasFuncAssignment() && funcInfo->GetParsedFunctionBody()->DoStackNestedFunc()))
                        {
                            // No point in trying to optimize if there are no references before we have to commit to slot.
                            // And not safe to delay putting a stack function in the slot, since we may miss boxing.
                            sym->SetIsCommittedToSlot();
                        }
                    }

                    // Undef-initialize the home location if it is a register (not closure-captured, or else capture
                    // is delayed) or a property of an object.
                    if ((!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo)) ||
                        (funcInfo->bodyScope->GetIsObject() && !funcInfo->GetHasCachedScope()))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg == Js::Constants::NoRegister)
                        {
                            Assert(sym->IsInSlot(this, funcInfo));
                            reg = funcInfo->AcquireTmpRegister();
                        }
                        this->m_writer.Reg1(Js::OpCode::LdUndef, reg);
                        this->EmitLocalPropInit(reg, sym, funcInfo);

                        if (ShouldTrackDebuggerMetadata() && !sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }

                        funcInfo->ReleaseTmpRegister(reg);
                    }
                }
                else if (ShouldTrackDebuggerMetadata())
                {
                    if (!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg != Js::Constants::NoRegister)
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }
                    }
                }
                sym->SetHasInit(TRUE);
            }
        }

    }
    if (tmpReg != Js::Constants::NoRegister)
    {
        funcInfo->ReleaseTmpRegister(tmpReg);
    }

    for (int i = 0; i < funcInfo->nonUserNonTempRegistersToInitialize.Count(); ++i)
    {
        m_writer.Reg1(Js::OpCode::LdUndef, funcInfo->nonUserNonTempRegistersToInitialize.Item(i));
    }
}